

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

uint_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
::getNormalizedSignificand
          (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
           *this)

{
  uint uVar1;
  uint_type significand_bits;
  uint uVar2;
  int iVar3;
  
  uVar2 = (this->value_).data_;
  if ((uVar2 & 0x7f800000) == 0 && (uVar2 & 0x7fffffff) != 0) {
    uVar1 = 0x1f;
    if ((uVar2 & 0x3fffff) != 0) {
      for (; (uVar2 & 0x3fffff) >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = -0x7f;
    if ((uVar2 >> 0x16 & 1) == 0) {
      iVar3 = (uVar1 ^ 0xffffffe0) - 0x75;
    }
    iVar3 = iVar3 + 0x7e;
    do {
      uVar2 = uVar2 * 2;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
  }
  return uVar2 & 0x7fffff;
}

Assistant:

uint_type data() const { return data_; }